

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall Heap<int>::heapify(Heap<int> *this,int i)

{
  ulong uVar1;
  int iVar2;
  pointer piVar3;
  bool bVar4;
  _Elt_pointer piVar5;
  int iVar6;
  int index;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s;
  int local_88;
  int local_84;
  _Deque_base<int,_std::allocator<int>_> local_80;
  
  local_84 = i;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&local_80);
  std::deque<int,_std::allocator<int>_>::push_back
            ((deque<int,_std::allocator<int>_> *)&local_80,&local_84);
  while (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
    piVar5 = local_80._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_80._M_impl.super__Deque_impl_data._M_finish._M_first) {
      piVar5 = local_80._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    iVar6 = piVar5[-1];
    uVar1 = (long)iVar6 * 2 + 1;
    piVar3 = (this->arr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_88 = iVar6;
    if ((uVar1 < (ulong)((long)(this->arr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar3 >> 2) >> 1) &&
       (bVar4 = (*this->compare)(piVar3[uVar1],piVar3[iVar6]), bVar4)) {
      local_88 = (int)uVar1;
    }
    iVar6 = iVar6 * 2 + 2;
    piVar3 = (this->arr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((ulong)(long)iVar6 <
         (ulong)((long)(this->arr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)piVar3 >> 2) >> 1) &&
       (bVar4 = (*this->compare)(piVar3[iVar6],piVar3[local_88]), bVar4)) {
      local_88 = iVar6;
    }
    if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_80._M_impl.super__Deque_impl_data._M_finish._M_first) {
      iVar6 = local_80._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x7f];
    }
    else {
      iVar6 = local_80._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
    }
    if (local_88 != iVar6) {
      piVar3 = (this->arr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = piVar3[iVar6];
      piVar3[iVar6] = piVar3[local_88];
      piVar3[local_88] = iVar2;
      std::deque<int,_std::allocator<int>_>::pop_back((deque<int,_std::allocator<int>_> *)&local_80)
      ;
      std::deque<int,_std::allocator<int>_>::push_back
                ((deque<int,_std::allocator<int>_> *)&local_80,&local_88);
    }
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_80);
  return;
}

Assistant:

void heapify(int i) {
        std::stack<int> s;
        s.push(i);

        while (!s.empty()) {
            int index = s.top();

            int left = 2 * index + 1;
            int right = 2 * index + 2;

            if (left < arr.size() / 2 && compare(arr[left], arr[index])) {
                index = left;
            }

            if (right < arr.size() / 2 && compare(arr[right], arr[index])) {
                index = right;
            }

            if (index != s.top()) {
                Swap(arr[s.top()], arr[index]);
                s.pop();

                s.push(index);
            }
        }
    }